

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseComponent.cpp
# Opt level: O2

void __thiscall BaseComponent::Subscribe(BaseComponent *this,Type type)

{
  pointer ppBVar1;
  mapped_type *pmVar2;
  __normal_iterator<BaseComponent_**,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>
  _Var3;
  vector<BaseComponent*,std::allocator<BaseComponent*>> *this_00;
  Type local_1c;
  BaseComponent *local_18;
  
  local_1c = type;
  std::mutex::lock(&eventsLock);
  pmVar2 = std::__detail::
           _Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&events,&local_1c);
  ppBVar1 = (pmVar2->super__Vector_base<BaseComponent_*,_std::allocator<BaseComponent_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pmVar2 = std::__detail::
           _Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&events,&local_1c);
  local_18 = this;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<BaseComponent**,std::vector<BaseComponent*,std::allocator<BaseComponent*>>>,__gnu_cxx::__ops::_Iter_equals_val<BaseComponent*const>>
                    (ppBVar1,(pmVar2->
                             super__Vector_base<BaseComponent_*,_std::allocator<BaseComponent_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish);
  pmVar2 = std::__detail::
           _Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&events,&local_1c);
  if (_Var3._M_current ==
      (pmVar2->super__Vector_base<BaseComponent_*,_std::allocator<BaseComponent_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    this_00 = (vector<BaseComponent*,std::allocator<BaseComponent*>> *)
              std::__detail::
              _Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&events,&local_1c);
    local_18 = this;
    std::vector<BaseComponent*,std::allocator<BaseComponent*>>::emplace_back<BaseComponent*>
              (this_00,&local_18);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&eventsLock);
  return;
}

Assistant:

void BaseComponent::Subscribe(Event::Type type) {
    std::lock_guard<std::mutex> lock(eventsLock);
    
    if(
        std::find(
            events[type].begin(), events[type].end(),
            this
        ) == events[type].end()
    ) {
        events[type].push_back(this);
    }
}